

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::RoaringCompressState::InitializeContainer(RoaringCompressState *this)

{
  idx_t iVar1;
  __int_type _Var2;
  bool bVar3;
  reference pvVar4;
  pointer pCVar5;
  validity_t *pvVar6;
  code *pcVar7;
  idx_t cardinality;
  long lVar8;
  value_type vVar9;
  validity_t *pvVar10;
  data_ptr_t pdVar11;
  uint uVar12;
  ulong uVar13;
  value_type metadata;
  value_type local_2c;
  
  if (this->total_count != this->analyze_state->total_count) {
    pvVar4 = vector<duckdb::roaring::ContainerMetadata,_true>::operator[]
                       (this->container_metadata,this->total_count >> 0xb);
    vVar9 = *pvVar4;
    uVar13 = this->analyze_state->total_count - (ulong)(this->container_state).appended_count;
    if (0x7ff < uVar13) {
      uVar13 = 0x800;
    }
    uVar12 = (int)uVar13 + 0x3f;
    local_2c = vVar9;
    bVar3 = CanStore(this,(ulong)(uVar12 & 0x1fc0),&local_2c);
    if (!bVar3) {
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      iVar1 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).start;
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      _Var2 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      FlushSegment(this);
      CreateEmptySegment(this,_Var2 + iVar1);
      vVar9 = (value_type)((uint)local_2c & 0xff);
    }
    if (vVar9.container_type == RUN_CONTAINER) {
      (this->container_state).append_function = AppendRun;
      pdVar11 = this->data_ptr;
      if ((ulong)local_2c.count < 4) {
        pvVar6 = (validity_t *)((ulong)(pdVar11 + 3) & 0xfffffffffffffffc);
        lVar8 = 0x10;
        pvVar10 = pvVar6;
      }
      else {
        pdVar11[0] = '\0';
        pdVar11[1] = '\0';
        pdVar11[2] = '\0';
        pdVar11[3] = '\0';
        pdVar11[4] = '\0';
        pdVar11[5] = '\0';
        pdVar11[6] = '\0';
        pdVar11[7] = '\0';
        pvVar6 = (validity_t *)this->data_ptr;
        (this->container_state).run_counts = (uint8_t *)pvVar6;
        lVar8 = 0x18;
        pvVar10 = pvVar6 + 1;
      }
      *(validity_t **)((long)(this->container_state).compressed_arrays + lVar8 + -0x20) = pvVar10;
      uVar13 = (ulong)((uint)local_2c.count * 4);
      if (3 < local_2c.count) {
        uVar13 = (ulong)local_2c.count * 2 + 8;
      }
    }
    else if (((uint)vVar9 & 0xff) == 2) {
      pdVar11 = (data_ptr_t)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      this->data_ptr = pdVar11;
      uVar13 = (ulong)(uVar12 >> 3 & 0x3f8);
      FastMemset(pdVar11,-1,uVar13);
      (this->container_state).append_function = AppendBitset;
      pvVar6 = (validity_t *)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      (this->container_state).uncompressed = pvVar6;
    }
    else {
      uVar13 = (ulong)local_2c.nulls;
      if (uVar13 == 0) {
        pcVar7 = AppendToArray<false>;
      }
      else {
        pcVar7 = AppendToArray<true>;
      }
      (this->container_state).append_function = pcVar7;
      pdVar11 = this->data_ptr;
      if ((ulong)local_2c.count < 8) {
        pvVar6 = (validity_t *)((ulong)(pdVar11 + 1) & 0xfffffffffffffffe);
        (this->container_state).arrays[uVar13] = (uint16_t *)pvVar6;
      }
      else {
        pdVar11[0] = '\0';
        pdVar11[1] = '\0';
        pdVar11[2] = '\0';
        pdVar11[3] = '\0';
        pdVar11[4] = '\0';
        pdVar11[5] = '\0';
        pdVar11[6] = '\0';
        pdVar11[7] = '\0';
        pvVar6 = (validity_t *)this->data_ptr;
        (this->container_state).array_counts[uVar13] = (uint8_t *)pvVar6;
        (this->container_state).compressed_arrays[uVar13] = (uint8_t *)(pvVar6 + 1);
      }
      uVar13 = (ulong)((uint)local_2c.count * 2);
      if (7 < local_2c.count) {
        uVar13 = (ulong)local_2c.count + 8;
      }
    }
    this->data_ptr = (data_ptr_t)((long)pvVar6 + uVar13);
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,local_2c);
  }
  return;
}

Assistant:

void RoaringCompressState::InitializeContainer() {
	if (total_count == analyze_state.total_count) {
		// No more containers left
		return;
	}
	auto container_index = GetContainerIndex();
	D_ASSERT(container_index < container_metadata.size());
	auto metadata = container_metadata[container_index];

	idx_t container_size = AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(
	    MinValue<idx_t>(analyze_state.total_count - container_state.appended_count, ROARING_CONTAINER_SIZE));
	if (!CanStore(container_size, metadata)) {
		idx_t row_start = current_segment->start + current_segment->count;
		FlushSegment();
		CreateEmptySegment(row_start);
	}

	// Override the pointer to write directly into the block
	if (metadata.IsUncompressed()) {
		data_ptr = reinterpret_cast<data_ptr_t>(AlignValue<idx_t>(reinterpret_cast<idx_t>(data_ptr)));
		FastMemset(data_ptr, ~0, sizeof(validity_t) * (container_size / ValidityMask::BITS_PER_VALUE));
		container_state.OverrideUncompressed(data_ptr);
	} else if (metadata.IsRun()) {
		auto number_of_runs = metadata.NumberOfRuns();
		container_state.OverrideRun(data_ptr, number_of_runs);
	} else {
		auto cardinality = metadata.Cardinality();
		container_state.OverrideArray(data_ptr, metadata.IsInverted(), cardinality);
	}
	data_ptr += metadata.GetDataSizeInBytes(container_size);
	metadata_collection.AddMetadata(metadata);
}